

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_drds_describe_drds_instances.cc
# Opt level: O0

void anon_unknown.dwarf_519a2::Json2Type(Value *value,DrdsDescribeDrdsInstancesInstanceType *item)

{
  bool bVar1;
  Int IVar2;
  Value *pVVar3;
  Json2Array<aliyun::DrdsDescribeDrdsInstancesVipType> local_f9;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  DrdsDescribeDrdsInstancesInstanceType *local_18;
  DrdsDescribeDrdsInstancesInstanceType *item_local;
  Value *value_local;
  
  local_18 = item;
  item_local = (DrdsDescribeDrdsInstancesInstanceType *)value;
  bVar1 = Json::Value::isMember(value,"DrdsInstanceId");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"DrdsInstanceId");
    Json::Value::asString_abi_cxx11_(&local_38,pVVar3);
    std::__cxx11::string::operator=((string *)&local_18->drds_instance_id,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"Type");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"Type");
    Json::Value::asString_abi_cxx11_(&local_58,pVVar3);
    std::__cxx11::string::operator=((string *)&local_18->type,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"RegionId");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"RegionId");
    Json::Value::asString_abi_cxx11_(&local_78,pVVar3);
    std::__cxx11::string::operator=((string *)&local_18->region_id,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"ZoneId");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"ZoneId");
    Json::Value::asString_abi_cxx11_(&local_98,pVVar3);
    std::__cxx11::string::operator=((string *)&local_18->zone_id,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"Description");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"Description");
    Json::Value::asString_abi_cxx11_(&local_b8,pVVar3);
    std::__cxx11::string::operator=((string *)&local_18->description,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"NetworkType");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"NetworkType");
    Json::Value::asString_abi_cxx11_(&local_d8,pVVar3);
    std::__cxx11::string::operator=((string *)&local_18->network_type,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"Status");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"Status");
    Json::Value::asString_abi_cxx11_(&local_f8,pVVar3);
    std::__cxx11::string::operator=((string *)&local_18->status,(string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"CreateTime");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"CreateTime");
    IVar2 = Json::Value::asInt(pVVar3);
    local_18->create_time = (long)IVar2;
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"Version");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"Version");
    IVar2 = Json::Value::asInt(pVVar3);
    local_18->version = (long)IVar2;
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"Vips");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"Vips");
    bVar1 = Json::Value::isMember(pVVar3,"Vip");
    if (bVar1) {
      pVVar3 = Json::Value::operator[]((Value *)item_local,"Vips");
      pVVar3 = Json::Value::operator[](pVVar3,"Vip");
      Json2Array<aliyun::DrdsDescribeDrdsInstancesVipType>::Json2Array
                (&local_f9,pVVar3,&local_18->vips);
    }
  }
  return;
}

Assistant:

void Json2Type(const Json::Value& value, DrdsDescribeDrdsInstancesInstanceType* item) {
  if(value.isMember("DrdsInstanceId")) {
    item->drds_instance_id = value["DrdsInstanceId"].asString();
  }
  if(value.isMember("Type")) {
    item->type = value["Type"].asString();
  }
  if(value.isMember("RegionId")) {
    item->region_id = value["RegionId"].asString();
  }
  if(value.isMember("ZoneId")) {
    item->zone_id = value["ZoneId"].asString();
  }
  if(value.isMember("Description")) {
    item->description = value["Description"].asString();
  }
  if(value.isMember("NetworkType")) {
    item->network_type = value["NetworkType"].asString();
  }
  if(value.isMember("Status")) {
    item->status = value["Status"].asString();
  }
  if(value.isMember("CreateTime")) {
    item->create_time = value["CreateTime"].asInt();
  }
  if(value.isMember("Version")) {
    item->version = value["Version"].asInt();
  }
  if(value.isMember("Vips") && value["Vips"].isMember("Vip")) {
    Json2Array<DrdsDescribeDrdsInstancesVipType>(value["Vips"]["Vip"], &item->vips);
  }
}